

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O0

void CMU462::Collada::ColladaParser::parse_camera(XMLElement *xml,CameraInfo *camera)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  CameraInfo *xml_00;
  char *pcVar4;
  XMLElement *pXVar5;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  allocator<char> local_b9;
  float aspect_ratio;
  XMLElement *local_98;
  XMLElement *e_aspect_ratio;
  XMLElement *e_zfar;
  XMLElement *e_znear;
  XMLElement *e_yfov;
  XMLElement *e_xfov;
  allocator<char> local_59;
  string local_58;
  XMLElement *local_38;
  XMLElement *e_perspective;
  double dStack_28;
  double local_20;
  CameraInfo *local_18;
  CameraInfo *camera_local;
  XMLElement *xml_local;
  
  local_18 = camera;
  camera_local = (CameraInfo *)xml;
  pcVar4 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::operator=((string *)&(local_18->super_Instance).id,pcVar4);
  pcVar4 = tinyxml2::XMLElement::Attribute((XMLElement *)camera_local,"name",(char *)0x0);
  std::__cxx11::string::operator=((string *)&(local_18->super_Instance).name,pcVar4);
  (local_18->super_Instance).type = CAMERA;
  (local_18->up_dir).z = (double)up._16_8_;
  uVar3 = up._8_8_;
  (local_18->up_dir).x = (double)up._0_8_;
  (local_18->up_dir).y = (double)uVar3;
  Vector3D::Vector3D((Vector3D *)&e_perspective,0.0,0.0,-1.0);
  xml_00 = camera_local;
  (local_18->view_dir).z = local_20;
  (local_18->view_dir).x = (double)e_perspective;
  (local_18->view_dir).y = dStack_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"optics/technique_common/perspective",&local_59);
  pXVar5 = get_element((XMLElement *)xml_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  local_38 = pXVar5;
  if (pXVar5 == (XMLElement *)0x0) {
    exit(1);
  }
  e_yfov = tinyxml2::XMLNode::FirstChildElement(&pXVar5->super_XMLNode,"xfov");
  e_znear = tinyxml2::XMLNode::FirstChildElement(&local_38->super_XMLNode,"yfov");
  e_zfar = tinyxml2::XMLNode::FirstChildElement(&local_38->super_XMLNode,"znear");
  e_aspect_ratio = tinyxml2::XMLNode::FirstChildElement(&local_38->super_XMLNode,"zfar");
  if (e_yfov == (XMLElement *)0x0) {
    local_e8 = 50.0;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(e_yfov);
    local_e8 = atof(pcVar4);
  }
  local_18->hFov = (float)local_e8;
  if (e_znear == (XMLElement *)0x0) {
    local_f0 = 35.0;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(e_znear);
    local_f0 = atof(pcVar4);
  }
  local_18->vFov = (float)local_f0;
  if (e_zfar == (XMLElement *)0x0) {
    local_f8 = 0.0010000000474974513;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(e_zfar);
    local_f8 = atof(pcVar4);
  }
  local_18->nClip = (float)local_f8;
  if (e_aspect_ratio == (XMLElement *)0x0) {
    local_100 = 1000.0;
  }
  else {
    pcVar4 = tinyxml2::XMLElement::GetText(e_aspect_ratio);
    local_100 = atof(pcVar4);
  }
  pXVar5 = local_38;
  local_18->fClip = (float)local_100;
  if (e_znear == (XMLElement *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aspect_ratio,"aspect_ratio",&local_b9);
    pXVar5 = get_element(pXVar5,(string *)&aspect_ratio);
    std::__cxx11::string::~string((string *)&aspect_ratio);
    std::allocator<char>::~allocator(&local_b9);
    local_98 = pXVar5;
    if (pXVar5 == (XMLElement *)0x0) {
      exit(1);
    }
    pcVar4 = tinyxml2::XMLElement::GetText(pXVar5);
    dVar1 = atof(pcVar4);
    dVar2 = radians<double>((double)local_18->hFov * 0.5);
    dVar2 = tan(dVar2);
    dVar1 = atan(dVar2 / (double)(float)dVar1);
    dVar1 = degrees<double>(dVar1);
    local_18->vFov = (float)(dVar1 * 2.0);
  }
  return;
}

Assistant:

void ColladaParser::parse_camera( XMLElement* xml, CameraInfo& camera ) {

  // name & id
  camera.id   = xml->Attribute( "id" );
  camera.name = xml->Attribute("name");
  camera.type = Instance::CAMERA;

	// default look direction is down the up axis
	camera.up_dir   = up;
	camera.view_dir = Vector3D(0,0,-1);

  // NOTE (sky): only supports perspective for now
  XMLElement* e_perspective = get_element(xml, "optics/technique_common/perspective");
  if (e_perspective) {
    XMLElement* e_xfov  = e_perspective->FirstChildElement("xfov" );
    XMLElement* e_yfov  = e_perspective->FirstChildElement("yfov" );
    XMLElement* e_znear = e_perspective->FirstChildElement("znear");
    XMLElement* e_zfar  = e_perspective->FirstChildElement("zfar" );

    camera.hFov  = e_xfov  ? atof(e_xfov  -> GetText()) : 50.0f;
    camera.vFov  = e_yfov  ? atof(e_yfov  -> GetText()) : 35.0f;
    camera.nClip = e_znear ? atof(e_znear -> GetText()) : 0.001f;
    camera.fClip = e_zfar  ? atof(e_zfar  -> GetText()) : 1000.0f;

    if (!e_yfov ) { // if vfov is not given, compute from aspect ratio
      XMLElement* e_aspect_ratio = get_element(e_perspective, "aspect_ratio");
      if (e_aspect_ratio) {
        float aspect_ratio = atof(e_aspect_ratio->GetText());
        camera.vFov = 2 * degrees(atan(tan(radians(0.5 * camera.hFov)) / aspect_ratio));
      } else {
        stat("Error: incomplete perspective definition in: " << camera.id);
        exit(EXIT_FAILURE);
      }
    }
  } else {
    stat("Error: no perspective defined in camera: " << camera.id );
    exit(EXIT_FAILURE);
  }

  // print summary
  stat("  |- " << camera);
}